

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressSequences_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  ZSTD_sequencePosition seqPos_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ZSTD_sequenceCopier p_Var4;
  size_t sVar5;
  size_t code;
  ulong srcSize_00;
  U32 cBlockHeader;
  size_t err_code_5;
  size_t err_code_4;
  size_t err_code_3;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  U32 lastBlock;
  size_t blockSize;
  size_t additionalByteAdjustment;
  size_t cBlockSize;
  size_t compressedSeqsSize;
  U32 cBlockHeader24;
  ZSTD_sequenceCopier sequenceCopier;
  BYTE *op;
  BYTE *ip;
  ZSTD_sequencePosition seqPos;
  size_t remaining;
  size_t cSize;
  void *src_local;
  size_t inSeqsSize_local;
  ZSTD_Sequence *inSeqs_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  remaining = 0;
  seqPos.posInSrc = srcSize;
  memset(&ip,0,0x10);
  p_Var4 = ZSTD_selectSequenceCopier((cctx->appliedParams).blockDelimiters);
  sequenceCopier = (ZSTD_sequenceCopier)dst;
  op = (BYTE *)src;
  inSeqs_local = (ZSTD_Sequence *)dstCapacity;
  if (seqPos.posInSrc == 0) {
    if (dstCapacity < 4) {
      return 0xffffffffffffffba;
    }
    MEM_writeLE32(dst,1);
    sequenceCopier = (ZSTD_sequenceCopier)((long)dst + 3);
    inSeqs_local = (ZSTD_Sequence *)(dstCapacity - 3);
    remaining = 3;
  }
  do {
    while( true ) {
      if (seqPos.posInSrc == 0) {
        return remaining;
      }
      seqPos_00.posInSrc._0_4_ = seqPos.idx;
      seqPos_00.posInSrc._4_4_ = seqPos.posInSequence;
      seqPos_00._0_8_ = ip;
      sVar5 = determine_blockSize((cctx->appliedParams).blockDelimiters,cctx->blockSize,
                                  seqPos.posInSrc,inSeqs,inSeqsSize,seqPos_00);
      uVar2 = (uint)(sVar5 == seqPos.posInSrc);
      uVar1 = ERR_isError(sVar5);
      if (uVar1 != 0) {
        return sVar5;
      }
      if (seqPos.posInSrc < sVar5) {
        __assert_fail("blockSize <= remaining",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1a33,
                      "size_t ZSTD_compressSequences_internal(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                     );
      }
      ZSTD_resetSeqStore(&cctx->seqStore);
      code = (*p_Var4)(cctx,(ZSTD_sequencePosition *)&ip,inSeqs,inSeqsSize,op,sVar5,
                       (cctx->appliedParams).searchForExternalRepcodes);
      uVar1 = ERR_isError(code);
      if (uVar1 != 0) {
        return code;
      }
      srcSize_00 = sVar5 - code;
      if (6 < srcSize_00) break;
      sVar5 = ZSTD_noCompressBlock(sequenceCopier,(size_t)inSeqs_local,op,srcSize_00,uVar2);
      uVar2 = ERR_isError(sVar5);
      if (uVar2 != 0) {
        return sVar5;
      }
      remaining = sVar5 + remaining;
      op = op + srcSize_00;
      sequenceCopier = sequenceCopier + sVar5;
      seqPos.posInSrc = seqPos.posInSrc - srcSize_00;
      inSeqs_local = (ZSTD_Sequence *)((long)inSeqs_local - sVar5);
    }
    if (inSeqs_local < (ZSTD_Sequence *)0x3) {
      return 0xffffffffffffffba;
    }
    cBlockSize = ZSTD_entropyCompressSeqStore
                           (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                            &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,
                            sequenceCopier + 3,(size_t)((long)&inSeqs_local[-1].rep + 1),srcSize_00,
                            cctx->entropyWorkspace,0x22d8,cctx->bmi2);
    uVar1 = ERR_isError(cBlockSize);
    if (uVar1 != 0) {
      return cBlockSize;
    }
    if (((cctx->isFirstBlock == 0) && (iVar3 = ZSTD_maybeRLE(&cctx->seqStore), iVar3 != 0)) &&
       (iVar3 = ZSTD_isRLE(op,srcSize_00), iVar3 != 0)) {
      cBlockSize = 1;
    }
    if (cBlockSize == 0) {
      additionalByteAdjustment =
           ZSTD_noCompressBlock(sequenceCopier,(size_t)inSeqs_local,op,srcSize_00,uVar2);
      uVar1 = ERR_isError(additionalByteAdjustment);
joined_r0x00d61516:
      if (uVar1 != 0) {
        return additionalByteAdjustment;
      }
    }
    else {
      if (cBlockSize == 1) {
        additionalByteAdjustment =
             ZSTD_rleCompressBlock(sequenceCopier,(size_t)inSeqs_local,*op,srcSize_00,uVar2);
        uVar1 = ERR_isError(additionalByteAdjustment);
        goto joined_r0x00d61516;
      }
      ZSTD_blockState_confirmRepcodesAndEntropyTables(&cctx->blockState);
      if ((((cctx->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
        (((cctx->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      MEM_writeLE24(sequenceCopier,uVar2 + 4 + (int)(cBlockSize << 3));
      additionalByteAdjustment = cBlockSize + 3;
    }
    remaining = additionalByteAdjustment + remaining;
    if (uVar2 != 0) {
      return remaining;
    }
    op = op + srcSize_00;
    sequenceCopier = sequenceCopier + additionalByteAdjustment;
    seqPos.posInSrc = seqPos.posInSrc - srcSize_00;
    inSeqs_local = (ZSTD_Sequence *)((long)inSeqs_local - additionalByteAdjustment);
    cctx->isFirstBlock = 0;
  } while( true );
}

Assistant:

static size_t
ZSTD_compressSequences_internal(ZSTD_CCtx* cctx,
                                void* dst, size_t dstCapacity,
                          const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                          const void* src, size_t srcSize)
{
    size_t cSize = 0;
    size_t remaining = srcSize;
    ZSTD_sequencePosition seqPos = {0, 0, 0};

    BYTE const* ip = (BYTE const*)src;
    BYTE* op = (BYTE*)dst;
    ZSTD_sequenceCopier const sequenceCopier = ZSTD_selectSequenceCopier(cctx->appliedParams.blockDelimiters);

    DEBUGLOG(4, "ZSTD_compressSequences_internal srcSize: %zu, inSeqsSize: %zu", srcSize, inSeqsSize);
    /* Special case: empty frame */
    if (remaining == 0) {
        U32 const cBlockHeader24 = 1 /* last block */ + (((U32)bt_raw)<<1);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "No room for empty frame block header");
        MEM_writeLE32(op, cBlockHeader24);
        op += ZSTD_blockHeaderSize;
        dstCapacity -= ZSTD_blockHeaderSize;
        cSize += ZSTD_blockHeaderSize;
    }

    while (remaining) {
        size_t compressedSeqsSize;
        size_t cBlockSize;
        size_t additionalByteAdjustment;
        size_t blockSize = determine_blockSize(cctx->appliedParams.blockDelimiters,
                                        cctx->blockSize, remaining,
                                        inSeqs, inSeqsSize, seqPos);
        U32 const lastBlock = (blockSize == remaining);
        FORWARD_IF_ERROR(blockSize, "Error while trying to determine block size");
        assert(blockSize <= remaining);
        ZSTD_resetSeqStore(&cctx->seqStore);
        DEBUGLOG(5, "Working on new block. Blocksize: %zu (total:%zu)", blockSize, (ip - (const BYTE*)src) + blockSize);

        additionalByteAdjustment = sequenceCopier(cctx, &seqPos, inSeqs, inSeqsSize, ip, blockSize, cctx->appliedParams.searchForExternalRepcodes);
        FORWARD_IF_ERROR(additionalByteAdjustment, "Bad sequence copy");
        blockSize -= additionalByteAdjustment;

        /* If blocks are too small, emit as a nocompress block */
        /* TODO: See 3090. We reduced MIN_CBLOCK_SIZE from 3 to 2 so to compensate we are adding
         * additional 1. We need to revisit and change this logic to be more consistent */
        if (blockSize < MIN_CBLOCK_SIZE+ZSTD_blockHeaderSize+1+1) {
            cBlockSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "Nocompress block failed");
            DEBUGLOG(5, "Block too small, writing out nocompress block: cSize: %zu", cBlockSize);
            cSize += cBlockSize;
            ip += blockSize;
            op += cBlockSize;
            remaining -= blockSize;
            dstCapacity -= cBlockSize;
            continue;
        }

        RETURN_ERROR_IF(dstCapacity < ZSTD_blockHeaderSize, dstSize_tooSmall, "not enough dstCapacity to write a new compressed block");
        compressedSeqsSize = ZSTD_entropyCompressSeqStore(&cctx->seqStore,
                                &cctx->blockState.prevCBlock->entropy, &cctx->blockState.nextCBlock->entropy,
                                &cctx->appliedParams,
                                op + ZSTD_blockHeaderSize /* Leave space for block header */, dstCapacity - ZSTD_blockHeaderSize,
                                blockSize,
                                cctx->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
                                cctx->bmi2);
        FORWARD_IF_ERROR(compressedSeqsSize, "Compressing sequences of block failed");
        DEBUGLOG(5, "Compressed sequences size: %zu", compressedSeqsSize);

        if (!cctx->isFirstBlock &&
            ZSTD_maybeRLE(&cctx->seqStore) &&
            ZSTD_isRLE(ip, blockSize)) {
            /* We don't want to emit our first block as a RLE even if it qualifies because
            * doing so will cause the decoder (cli only) to throw a "should consume all input error."
            * This is only an issue for zstd <= v1.4.3
            */
            compressedSeqsSize = 1;
        }

        if (compressedSeqsSize == 0) {
            /* ZSTD_noCompressBlock writes the block header as well */
            cBlockSize = ZSTD_noCompressBlock(op, dstCapacity, ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "ZSTD_noCompressBlock failed");
            DEBUGLOG(5, "Writing out nocompress block, size: %zu", cBlockSize);
        } else if (compressedSeqsSize == 1) {
            cBlockSize = ZSTD_rleCompressBlock(op, dstCapacity, *ip, blockSize, lastBlock);
            FORWARD_IF_ERROR(cBlockSize, "ZSTD_rleCompressBlock failed");
            DEBUGLOG(5, "Writing out RLE block, size: %zu", cBlockSize);
        } else {
            U32 cBlockHeader;
            /* Error checking and repcodes update */
            ZSTD_blockState_confirmRepcodesAndEntropyTables(&cctx->blockState);
            if (cctx->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
                cctx->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

            /* Write block header into beginning of block*/
            cBlockHeader = lastBlock + (((U32)bt_compressed)<<1) + (U32)(compressedSeqsSize << 3);
            MEM_writeLE24(op, cBlockHeader);
            cBlockSize = ZSTD_blockHeaderSize + compressedSeqsSize;
            DEBUGLOG(5, "Writing out compressed block, size: %zu", cBlockSize);
        }

        cSize += cBlockSize;

        if (lastBlock) {
            break;
        } else {
            ip += blockSize;
            op += cBlockSize;
            remaining -= blockSize;
            dstCapacity -= cBlockSize;
            cctx->isFirstBlock = 0;
        }
        DEBUGLOG(5, "cSize running total: %zu (remaining dstCapacity=%zu)", cSize, dstCapacity);
    }

    DEBUGLOG(4, "cSize final total: %zu", cSize);
    return cSize;
}